

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void init_error_limit(j_decompress_ptr cinfo)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  int out;
  int in;
  int *table;
  my_cquantize_ptr_conflict cquantize;
  int local_20;
  uint local_1c;
  
  lVar1 = *(long *)(in_RDI + 0x270);
  lVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x7fc);
  lVar2 = lVar2 + 0x3fc;
  *(long *)(lVar1 + 0x50) = lVar2;
  local_20 = 0;
  for (local_1c = 0; (int)local_1c < 0x10; local_1c = local_1c + 1) {
    *(int *)(lVar2 + (long)(int)local_1c * 4) = local_20;
    *(int *)(lVar2 + (long)(int)-local_1c * 4) = -local_20;
    local_20 = local_20 + 1;
  }
  while ((int)local_1c < 0x30) {
    *(int *)(lVar2 + (long)(int)local_1c * 4) = local_20;
    *(int *)(lVar2 + (long)(int)-local_1c * 4) = -local_20;
    local_1c = local_1c + 1;
    local_20 = (uint)((local_1c & 1) == 0) + local_20;
  }
  for (; (int)local_1c < 0x100; local_1c = local_1c + 1) {
    *(int *)(lVar2 + (long)(int)local_1c * 4) = local_20;
    *(int *)(lVar2 + (long)(int)-local_1c * 4) = -local_20;
  }
  return;
}

Assistant:

LOCAL(void)
init_error_limit(j_decompress_ptr cinfo)
/* Allocate and fill in the error_limiter table */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  int *table;
  int in, out;

  table = (int *)(*cinfo->mem->alloc_small)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, (MAXJSAMPLE * 2 + 1) * sizeof(int));
  table += MAXJSAMPLE;          /* so can index -MAXJSAMPLE .. +MAXJSAMPLE */
  cquantize->error_limiter = table;

#define STEPSIZE  ((MAXJSAMPLE + 1) / 16)
  /* Map errors 1:1 up to +- MAXJSAMPLE/16 */
  out = 0;
  for (in = 0; in < STEPSIZE; in++, out++) {
    table[in] = out;  table[-in] = -out;
  }
  /* Map errors 1:2 up to +- 3*MAXJSAMPLE/16 */
  for (; in < STEPSIZE * 3; in++, out += (in & 1) ? 0 : 1) {
    table[in] = out;  table[-in] = -out;
  }
  /* Clamp the rest to final out value (which is (MAXJSAMPLE+1)/8) */
  for (; in <= MAXJSAMPLE; in++) {
    table[in] = out;  table[-in] = -out;
  }
#undef STEPSIZE
}